

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_medcon_external(CImg<unsigned_char> *this,char *filename)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  CImgArgumentException *this_00;
  char *pcVar6;
  char *pcVar7;
  FILE *pFVar8;
  ulong uVar9;
  char *pcVar10;
  CImg<char> *pCVar11;
  char *pcVar12;
  cimg *this_01;
  CImgIOException *this_02;
  CImg<char> local_d8;
  CImg<char> local_b8;
  FILE *local_98;
  FILE *file;
  CImg<char> body;
  CImg<char> filename_tmp;
  CImg<char> command;
  char *filename_local;
  CImg<unsigned_char> *this_local;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    puVar5 = this->_data;
    pcVar6 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar6 = "";
    }
    pcVar7 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_medcon_external(): Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar6,pcVar7);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  pFVar8 = cimg::fopen(filename,"rb");
  fclose(pFVar8);
  CImg<char>::CImg((CImg<char> *)&filename_tmp._data,0x400,1,1,1);
  CImg<char>::CImg((CImg<char> *)&body._data,0x100,1,1,1);
  CImg<char>::CImg((CImg<char> *)&file,0x100,1,1,1);
  pFVar8 = cimg::fopen(filename,"r");
  cimg::fclose(pFVar8);
  local_98 = (FILE *)0x0;
  do {
    pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&body._data);
    uVar9 = (ulong)(uint)body._data;
    cimg::filenamerand();
    snprintf(pcVar6,uVar9,"%s.hdr");
    pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&body._data);
    local_98 = fopen(pcVar6,"rb");
    if (local_98 != (FILE *)0x0) {
      cimg::fclose(local_98);
    }
  } while (local_98 != (FILE *)0x0);
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
  uVar9 = (ulong)(uint)filename_tmp._data;
  pcVar7 = cimg::medcon_path((char *)0x0,false);
  pcVar10 = cimg_library::CImg::operator_cast_to_char_((CImg *)&body._data);
  CImg<char>::string(&local_b8,pcVar10,true,false);
  pCVar11 = CImg<char>::_system_strescape(&local_b8);
  pcVar10 = CImg<char>::data(pCVar11);
  CImg<char>::string(&local_d8,filename,true,false);
  pCVar11 = CImg<char>::_system_strescape(&local_d8);
  pcVar12 = CImg<char>::data(pCVar11);
  snprintf(pcVar6,uVar9,"%s -w -c anlz -o \"%s\" -f \"%s\"",pcVar7,pcVar10,pcVar12);
  CImg<char>::~CImg(&local_d8);
  CImg<char>::~CImg(&local_b8);
  this_01 = (cimg *)cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
  cimg::system(this_01,(char *)0x0);
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&body._data);
  pcVar7 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
  cimg::split_filename(pcVar6,pcVar7);
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
  snprintf(pcVar6,(ulong)(uint)filename_tmp._data,"%s.hdr",body._16_8_);
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
  local_98 = fopen(pcVar6,"rb");
  if (local_98 == (FILE *)0x0) {
    pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
    snprintf(pcVar6,(ulong)(uint)filename_tmp._data,"m000-%s.hdr",body._16_8_);
    pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
    local_98 = fopen(pcVar6,"rb");
    if (local_98 == (FILE *)0x0) {
      this_02 = (CImgIOException *)__cxa_allocate_exception(0x10);
      uVar1 = this->_width;
      uVar2 = this->_height;
      uVar3 = this->_depth;
      uVar4 = this->_spectrum;
      puVar5 = this->_data;
      pcVar6 = "non-";
      if ((this->_is_shared & 1U) != 0) {
        pcVar6 = "";
      }
      pcVar7 = pixel_type();
      CImgIOException::CImgIOException
                (this_02,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_medcon_external(): Failed to load file \'%s\' with external command \'medcon\'."
                 ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar6,pcVar7,filename)
      ;
      __cxa_throw(this_02,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
    }
  }
  cimg::fclose(local_98);
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
  load_analyze(this,pcVar6,(float *)0x0);
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
  remove(pcVar6);
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
  pcVar7 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
  cimg::split_filename(pcVar6,pcVar7);
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
  snprintf(pcVar6,(ulong)(uint)filename_tmp._data,"%s.img",body._16_8_);
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
  remove(pcVar6);
  CImg<char>::~CImg((CImg<char> *)&file);
  CImg<char>::~CImg((CImg<char> *)&body._data);
  CImg<char>::~CImg((CImg<char> *)&filename_tmp._data);
  return this;
}

Assistant:

CImg<T>& load_medcon_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_medcon_external(): Specified filename is (null).",
                                    cimg_instance);
      std::fclose(cimg::fopen(filename,"rb"));            // Check if file exists.
      CImg<charT> command(1024), filename_tmp(256), body(256);
      cimg::fclose(cimg::fopen(filename,"r"));
      std::FILE *file = 0;
      do {
        cimg_snprintf(filename_tmp,filename_tmp._width,"%s.hdr",cimg::filenamerand());
        if ((file=std::fopen(filename_tmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,command._width,"%s -w -c anlz -o \"%s\" -f \"%s\"",
                    cimg::medcon_path(),
                    CImg<charT>::string(filename_tmp)._system_strescape().data(),
                    CImg<charT>::string(filename)._system_strescape().data());
      cimg::system(command);
      cimg::split_filename(filename_tmp,body);

      cimg_snprintf(command,command._width,"%s.hdr",body._data);
      file = std::fopen(command,"rb");
      if (!file) {
        cimg_snprintf(command,command._width,"m000-%s.hdr",body._data);
        file = std::fopen(command,"rb");
        if (!file) {
          throw CImgIOException(_cimg_instance
                                "load_medcon_external(): Failed to load file '%s' with external command 'medcon'.",
                                cimg_instance,
                                filename);
        }
      }
      cimg::fclose(file);
      load_analyze(command);
      std::remove(command);
      cimg::split_filename(command,body);
      cimg_snprintf(command,command._width,"%s.img",body._data);
      std::remove(command);
      return *this;
    }